

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

void __thiscall testing::internal::DeathTestImpl::ReadAndInterpretStatusByte(DeathTestImpl *this)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  ssize_t sVar4;
  int *piVar5;
  ostream *poVar6;
  int iVar7;
  long in_FS_OFFSET;
  int local_210;
  allocator<char> local_20a;
  char flag;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  Message error;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  char buffer [256];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    sVar4 = read(this->read_fd_,&flag,1);
    iVar2 = (int)sVar4;
    if (iVar2 != -1) {
      if (iVar2 == 0) {
        this->outcome_ = DIED;
        goto LAB_0015439b;
      }
      if (iVar2 == 1) {
        if (flag == 'I') {
          iVar2 = this->read_fd_;
          Message::Message(&error);
          goto LAB_001544f6;
        }
        if (flag == 'L') {
          this->outcome_ = LIVED;
        }
        else if (flag == 'T') {
          this->outcome_ = THREW;
        }
        else if (flag == 'R') {
          this->outcome_ = RETURNED;
        }
        else {
          GTestLog::GTestLog((GTestLog *)buffer,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-death-test.cc"
                             ,0x1e1);
          poVar6 = std::operator<<((ostream *)&std::cerr,"Death test child process reported ");
          poVar6 = std::operator<<(poVar6,"unexpected status byte (");
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::operator<<(poVar6,")");
          GTestLog::~GTestLog((GTestLog *)buffer);
        }
        goto LAB_0015439b;
      }
      break;
    }
    piVar5 = __errno_location();
  } while (*piVar5 == 4);
  GTestLog::GTestLog((GTestLog *)&local_148,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-death-test.cc"
                     ,0x1e6);
  poVar6 = std::operator<<((ostream *)&std::cerr,"Read from death test child process failed: ");
  GetLastErrnoDescription_abi_cxx11_();
  std::operator<<(poVar6,(string *)buffer);
  std::__cxx11::string::~string((string *)buffer);
  GTestLog::~GTestLog((GTestLog *)&local_148);
  goto LAB_0015439b;
  while( true ) {
    piVar5 = __errno_location();
    iVar7 = *piVar5;
    if (iVar7 != 4) break;
LAB_001544f6:
    while( true ) {
      sVar4 = read(iVar2,buffer,0xff);
      uVar3 = (uint)sVar4;
      if ((int)uVar3 < 1) break;
      buffer[uVar3 & 0x7fffffff] = '\0';
      std::operator<<((ostream *)((long)error.ss_.ptr_ + 0x10),buffer);
    }
    if (uVar3 != 0xffffffff) {
      if (uVar3 == 0) {
        GTestLog::GTestLog((GTestLog *)&local_188,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-death-test.cc"
                           ,0x160);
        StringStreamToString(&local_148,(stringstream *)error.ss_.ptr_);
        std::operator<<((ostream *)&std::cerr,(string *)&local_148);
        goto LAB_00154679;
      }
      piVar5 = __errno_location();
      iVar7 = *piVar5;
      break;
    }
  }
  GTestLog::GTestLog((GTestLog *)&local_188,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-death-test.cc"
                     ,0x163);
  poVar6 = std::operator<<((ostream *)&std::cerr,"Error while reading death test internal: ");
  GetLastErrnoDescription_abi_cxx11_();
  poVar6 = std::operator<<(poVar6,(string *)&local_148);
  poVar6 = std::operator<<(poVar6," [");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar7);
  std::operator<<(poVar6,"]");
LAB_00154679:
  std::__cxx11::string::~string((string *)&local_148);
  GTestLog::~GTestLog((GTestLog *)&local_188);
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&error.ss_);
LAB_0015439b:
  do {
    iVar2 = close(this->read_fd_);
    if (iVar2 != -1) goto LAB_0015449c;
    piVar5 = __errno_location();
  } while (*piVar5 == 4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"CHECK failed: File ",&local_20a);
  std::operator+(&local_1c8,&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-death-test.cc"
                );
  std::operator+(&local_1a8,&local_1c8,", line ");
  local_210 = 0x1e9;
  StreamableToString<int>(&local_208,&local_210);
  std::operator+(&local_188,&local_1a8,&local_208);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&error,
                 &local_188,": ");
  std::operator+(&local_148,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&error,
                 "posix::Close(read_fd())");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,
                 &local_148," != -1");
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    DeathTestAbort((string *)buffer);
LAB_0015449c:
    this->read_fd_ = -1;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void DeathTestImpl::ReadAndInterpretStatusByte() {
  char flag;
  int bytes_read;

  // The read() here blocks until data is available (signifying the
  // failure of the death test) or until the pipe is closed (signifying
  // its success), so it's okay to call this in the parent before
  // the child process has exited.
  do {
    bytes_read = posix::Read(read_fd(), &flag, 1);
  } while (bytes_read == -1 && errno == EINTR);

  if (bytes_read == 0) {
    set_outcome(DIED);
  } else if (bytes_read == 1) {
    switch (flag) {
      case kDeathTestReturned:
        set_outcome(RETURNED);
        break;
      case kDeathTestThrew:
        set_outcome(THREW);
        break;
      case kDeathTestLived:
        set_outcome(LIVED);
        break;
      case kDeathTestInternalError:
        FailFromInternalError(read_fd());  // Does not return.
        break;
      default:
        GTEST_LOG_(FATAL) << "Death test child process reported "
                          << "unexpected status byte ("
                          << static_cast<unsigned int>(flag) << ")";
    }
  } else {
    GTEST_LOG_(FATAL) << "Read from death test child process failed: "
                      << GetLastErrnoDescription();
  }
  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Close(read_fd()));
  set_read_fd(-1);
}